

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingState<unsigned_int,_int>::CalculateDeltaStats
          (BitpackingState<unsigned_int,_int> *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long in_RDI;
  idx_t i_2;
  bool success;
  int64_t i_1;
  int64_t i;
  bool can_do_all;
  uint6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  bool bVar4;
  bool bVar5;
  ulong local_30;
  long local_18;
  
  uVar1 = *(uint *)(in_RDI + 0x482c);
  uVar2 = NumericLimits<int>::Maximum();
  if (((uVar1 <= uVar2) && (1 < *(ulong *)(in_RDI + 0x4810))) &&
     ((*(byte *)(in_RDI + 0x4844) & 1) != 0)) {
    for (local_18 = 0; local_18 < *(long *)(in_RDI + 0x4810); local_18 = local_18 + 1) {
      *(int *)(in_RDI + 0x2010 + local_18 * 4) =
           *(int *)(*(long *)(in_RDI + 0x2008) + local_18 * 4) -
           *(int *)(*(long *)(in_RDI + 0x2008) + (local_18 + -1) * 4);
    }
    *(undefined1 *)(in_RDI + 0x4846) = 1;
    for (local_30 = 1; local_30 < *(ulong *)(in_RDI + 0x4810); local_30 = local_30 + 1) {
      iVar3 = MaxValue<int>(*(int *)(in_RDI + 0x4838),*(int *)(in_RDI + 0x2010 + local_30 * 4));
      *(int *)(in_RDI + 0x4838) = iVar3;
      iVar3 = MinValue<int>(*(int *)(in_RDI + 0x4834),*(int *)(in_RDI + 0x2010 + local_30 * 4));
      *(int *)(in_RDI + 0x4834) = iVar3;
    }
    *(undefined4 *)(in_RDI + 0x2010) = *(undefined4 *)(in_RDI + 0x4834);
    bVar5 = false;
    if ((*(byte *)(in_RDI + 0x4846) & 1) != 0) {
      bVar5 = TrySubtractOperator::Operation<int,int,int>
                        ((int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,
                         (int32_t *)
                         (ulong)CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8));
    }
    *(bool *)(in_RDI + 0x4846) = bVar5;
    bVar4 = false;
    if ((*(byte *)(in_RDI + 0x4846) & 1) != 0) {
      bVar4 = TrySubtractOperator::Operation<int,int,int>
                        ((int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,
                         (int32_t *)CONCAT17(bVar5,(uint7)in_stack_ffffffffffffffb8));
    }
    *(bool *)(in_RDI + 0x4846) = bVar4;
  }
  return;
}

Assistant:

void CalculateDeltaStats() {
		// TODO: currently we dont support delta compression of values above NumericLimits<T_S>::Maximum(),
		// 		 we could support this with some clever substract trickery?
		if (maximum > static_cast<T>(NumericLimits<T_S>::Maximum())) {
			return;
		}

		// Don't delta encoding 1 value makes no sense
		if (compression_buffer_idx < 2) {
			return;
		}

		// TODO: handle NULLS here?
		// Currently we cannot handle nulls because we would need an additional step of patching for this.
		// we could for example copy the last value on a null insert. This would help a bit, but not be optimal for
		// large deltas since theres suddenly a zero then. Ideally we would insert a value that leads to a delta within
		// the current domain of deltas however we dont know that domain here yet
		if (!all_valid) {
			return;
		}

		// Note: since we dont allow any values over NumericLimits<T_S>::Maximum(), all subtractions for unsigned types
		// are guaranteed not to overflow
		bool can_do_all = true;
		if (NumericLimits<T>::IsSigned()) {
			T_S bogus;
			can_do_all = TrySubtractOperator::Operation(static_cast<T_S>(minimum), static_cast<T_S>(maximum), bogus) &&
			             TrySubtractOperator::Operation(static_cast<T_S>(maximum), static_cast<T_S>(minimum), bogus);
		}

		// Calculate delta's
		// compression_buffer pointer points one element ahead of the internal buffer making the use of signed index
		// integer (-1) possible
		D_ASSERT(compression_buffer_idx <= NumericLimits<int64_t>::Maximum());
		if (can_do_all) {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				delta_buffer[i] = static_cast<T_S>(compression_buffer[i]) - static_cast<T_S>(compression_buffer[i - 1]);
			}
		} else {
			for (int64_t i = 0; i < static_cast<int64_t>(compression_buffer_idx); i++) {
				auto success =
				    TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[i]),
				                                   static_cast<T_S>(compression_buffer[i - 1]), delta_buffer[i]);
				if (!success) {
					return;
				}
			}
		}

		can_do_delta = true;

		for (idx_t i = 1; i < compression_buffer_idx; i++) {
			maximum_delta = MaxValue<T_S>(maximum_delta, delta_buffer[i]);
			minimum_delta = MinValue<T_S>(minimum_delta, delta_buffer[i]);
		}

		// Since we can set the first value arbitrarily, we want to pick one from the current domain, note that
		// we will store the original first value - this offset as the  delta_offset to be able to decode this again.
		delta_buffer[0] = minimum_delta;

		can_do_delta = can_do_delta && TrySubtractOperator::Operation(maximum_delta, minimum_delta, min_max_delta_diff);
		can_do_delta = can_do_delta && TrySubtractOperator::Operation(static_cast<T_S>(compression_buffer[0]),
		                                                              minimum_delta, delta_offset);
	}